

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThrowStatement.h
# Opt level: O0

void __thiscall ThrowStatement::execute(ThrowStatement *this,Environment *env)

{
  bool bVar1;
  element_type *peVar2;
  ThrowPacket *this_00;
  shared_ptr<Value> local_38;
  undefined1 local_28 [8];
  ptr<Value> toThrow;
  Environment *env_local;
  ThrowStatement *this_local;
  
  toThrow.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)env;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->expression);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->expression);
    (**peVar2->_vptr_Expression)
              (local_28,peVar2,
               toThrow.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  else {
    std::shared_ptr<Value>::shared_ptr((shared_ptr<Value> *)local_28,(nullptr_t)0x0);
  }
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::shared_ptr<Value>::shared_ptr(&local_38,(shared_ptr<Value> *)local_28);
  ThrowPacket::ThrowPacket(this_00,&local_38);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> toThrow = expression ? expression->evaluate(env) : nullptr;
        throw ThrowPacket(toThrow);
    }